

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O3

CBlockIndex * __thiscall CBlockIndex::GetAncestor(CBlockIndex *this,int height)

{
  uint uVar1;
  CBlockIndex *pCVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  
  uVar1 = this->nHeight;
  if (height < 0 || this->nHeight < height) {
    this = (CBlockIndex *)0x0;
LAB_004504a7:
    if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
      __stack_chk_fail();
    }
    return this;
  }
joined_r0x004503e3:
  do {
    pCVar2 = this;
    this = pCVar2;
    if ((int)uVar1 <= height) goto LAB_004504a7;
    if ((int)uVar1 < 2) {
      uVar3 = 0;
      uVar5 = 0;
    }
    else {
      if ((uVar1 & 1) == 0) {
        uVar3 = uVar1 + 0x7fffffff & uVar1;
      }
      else {
        uVar3 = uVar1 + 0x7ffffffe & uVar1 - 1;
        uVar3 = uVar3 + 0x7fffffff & uVar3 | 1;
      }
      uVar5 = 0;
      if (uVar1 != 2) {
        if ((uVar1 - 1 & 1) == 0) {
          uVar5 = uVar1 + 0x7ffffffe & uVar1 - 1;
        }
        else {
          uVar5 = uVar1 + 0x7ffffffd & uVar1 - 2;
          uVar5 = uVar5 + 0x7fffffff & uVar5 | 1;
        }
      }
    }
    uVar4 = uVar1 - 1;
    this = pCVar2->pskip;
    if (this != (CBlockIndex *)0x0) {
      if (uVar3 == height) goto LAB_004504a7;
      if ((height < (int)uVar3) &&
         (uVar1 = uVar3, (int)uVar5 < height || (int)(uVar3 - 2) <= (int)uVar5))
      goto joined_r0x004503e3;
    }
    uVar1 = uVar4;
    this = pCVar2->pprev;
    if (pCVar2->pprev == (CBlockIndex *)0x0) {
      __assert_fail("pindexWalk->pprev",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.cpp"
                    ,0x70,"const CBlockIndex *CBlockIndex::GetAncestor(int) const");
    }
  } while( true );
}

Assistant:

const CBlockIndex* CBlockIndex::GetAncestor(int height) const
{
    if (height > nHeight || height < 0) {
        return nullptr;
    }

    const CBlockIndex* pindexWalk = this;
    int heightWalk = nHeight;
    while (heightWalk > height) {
        int heightSkip = GetSkipHeight(heightWalk);
        int heightSkipPrev = GetSkipHeight(heightWalk - 1);
        if (pindexWalk->pskip != nullptr &&
            (heightSkip == height ||
             (heightSkip > height && !(heightSkipPrev < heightSkip - 2 &&
                                       heightSkipPrev >= height)))) {
            // Only follow pskip if pprev->pskip isn't better than pskip->pprev.
            pindexWalk = pindexWalk->pskip;
            heightWalk = heightSkip;
        } else {
            assert(pindexWalk->pprev);
            pindexWalk = pindexWalk->pprev;
            heightWalk--;
        }
    }
    return pindexWalk;
}